

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

aiLight * __thiscall Assimp::XGLImporter::ReadDirectionalLight(XGLImporter *this)

{
  _Head_base<0UL,_aiLight_*,_false> _Var1;
  bool bVar2;
  aiLight *this_00;
  aiVector3D aVar3;
  unique_ptr<aiLight,_std::default_delete<aiLight>_> l;
  _Head_base<0UL,_aiLight_*,_false> local_68;
  undefined1 local_60 [16];
  string local_50;
  
  this_00 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00);
  this_00->mType = aiLightSource_DIRECTIONAL;
  local_68._M_head_impl = this_00;
  while( true ) {
    bVar2 = ReadElementUpToClosing(this,"directionallight");
    _Var1._M_head_impl = local_68._M_head_impl;
    if (!bVar2) break;
    GetElementName_abi_cxx11_(&local_50,this);
    bVar2 = std::operator==(&local_50,"direction");
    if (bVar2) {
      aVar3 = ReadVec3(this);
      (local_68._M_head_impl)->mDirection = aVar3;
    }
    else {
      bVar2 = std::operator==(&local_50,"diffuse");
      if (bVar2) {
        ReadCol3((XGLImporter *)local_60);
        ((local_68._M_head_impl)->mColorDiffuse).r = (ai_real)local_60._0_4_;
        ((local_68._M_head_impl)->mColorDiffuse).g = (ai_real)local_60._4_4_;
        ((local_68._M_head_impl)->mColorDiffuse).b = (ai_real)local_60._8_4_;
      }
      else {
        bVar2 = std::operator==(&local_50,"specular");
        if (bVar2) {
          ReadCol3((XGLImporter *)local_60);
          ((local_68._M_head_impl)->mColorSpecular).r = (ai_real)local_60._0_4_;
          ((local_68._M_head_impl)->mColorSpecular).g = (ai_real)local_60._4_4_;
          ((local_68._M_head_impl)->mColorSpecular).b = (ai_real)local_60._8_4_;
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_68._M_head_impl = (aiLight *)0x0;
  std::unique_ptr<aiLight,_std::default_delete<aiLight>_>::~unique_ptr
            ((unique_ptr<aiLight,_std::default_delete<aiLight>_> *)&local_68);
  return _Var1._M_head_impl;
}

Assistant:

aiLight* XGLImporter::ReadDirectionalLight()
{
    std::unique_ptr<aiLight> l(new aiLight());
    l->mType = aiLightSource_DIRECTIONAL;

    while (ReadElementUpToClosing("directionallight"))  {
        const std::string& s = GetElementName();
        if (s == "direction") {
            l->mDirection = ReadVec3();
        }
        else if (s == "diffuse") {
            l->mColorDiffuse = ReadCol3();
        }
        else if (s == "specular") {
            l->mColorSpecular = ReadCol3();
        }
    }
    return l.release();
}